

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O2

char * __thiscall ExportEntryWrapper::getFuncName(ExportEntryWrapper *this)

{
  Executable *pEVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  
  oVar3 = getFuncNameRva(this);
  if (oVar3 != 0xffffffffffffffff) {
    pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
    UNRECOVERED_JUMPTABLE = (pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe];
    iVar2 = (*UNRECOVERED_JUMPTABLE)(pEVar1,oVar3,2,1,0,UNRECOVERED_JUMPTABLE);
    return (char *)CONCAT44(extraout_var,iVar2);
  }
  return (char *)0x0;
}

Assistant:

char* ExportEntryWrapper::getFuncName()
{
    uint64_t funcRva = getFuncNameRva();
    if (funcRva == INVALID_ADDR) return NULL;

    char* name = (char*) this->m_Exe->getContentAt(funcRva, Executable::RVA, 1);
    if (name == NULL) return NULL;
    //TODO.... verify
    return name;
}